

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_mul(sexp ctx,sexp a,sexp b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sexp a_00;
  ulong uVar4;
  sexp a_01;
  int iVar5;
  long lVar6;
  double dVar7;
  sexp psStack_50;
  double local_48;
  sexp tmp;
  sexp_gc_var_t local_38;
  
  iVar1 = sexp_number_type(a);
  iVar2 = sexp_number_type(b);
  local_38.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  psStack_50 = a;
  a_00 = b;
  iVar5 = iVar1;
  if (iVar1 <= iVar2) {
    psStack_50 = (sexp)&DAT_0000043e;
    a_00 = a;
    a = b;
    iVar5 = iVar2;
    iVar2 = iVar1;
  }
  uVar3 = iVar2 * 6 + iVar5;
  if (0x23 < uVar3) goto switchD_001188c0_caseD_5;
  lVar6 = (long)a_00 >> 1;
  switch(uVar3) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    psStack_50 = sexp_type_exception(ctx,(sexp)0x0,3,a_00);
    break;
  case 7:
    uVar4 = lVar6 * ((long)a >> 1);
    if (SUB168(SEXT816(lVar6) * SEXT816((long)a >> 1),8) + (ulong)(0xbfffffffffffffff < uVar4) <
        (ulong)(uVar4 + 0x4000000000000000 < 0x8000000000000000)) {
      psStack_50 = (sexp)(uVar4 * 2 + 1);
    }
    else {
      tmp = sexp_fixnum_to_bignum(ctx,a_00);
      psStack_50 = sexp_mul(ctx,tmp,a);
    }
    break;
  case 8:
    if (a_00 == (sexp)&DAT_00000001) {
      psStack_50 = (sexp)&DAT_00000001;
      break;
    }
    dVar7 = (double)lVar6;
    goto LAB_00118a13;
  case 9:
    uVar4 = (ulong)a_00 >> 1;
    if ((long)a_00 < 0) {
      uVar4 = -lVar6;
    }
    a_01 = sexp_bignum_fxmul(ctx,(sexp)0x0,a,uVar4,0);
    (a_01->value).flonum_bits[0] = (a->value).flonum_bits[0] * ((byte)((long)a_00 >> 0x3f) | 1);
    goto LAB_001189ec;
  case 10:
  case 0x16:
    a_00 = sexp_make_ratio(ctx,a_00,(sexp)&DAT_00000003);
    tmp = a_00;
  case 0x1c:
    psStack_50 = sexp_ratio_mul(ctx,a_00,a);
    break;
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
    a_00 = sexp_make_complex(ctx,a_00,(sexp)&DAT_00000001);
    tmp = a_00;
  case 0x23:
    psStack_50 = sexp_complex_mul(ctx,a_00,a);
    break;
  case 0xe:
    dVar7 = (a_00->value).flonum;
LAB_00118a13:
    dVar7 = dVar7 * (a->value).flonum;
LAB_00118a19:
    psStack_50 = sexp_make_flonum(ctx,dVar7);
    break;
  case 0xf:
    local_48 = (a_00->value).flonum;
    dVar7 = sexp_bignum_to_double(a);
    goto LAB_00118a06;
  case 0x10:
    local_48 = (a_00->value).flonum;
    dVar7 = sexp_ratio_to_double(ctx,a);
LAB_00118a06:
    dVar7 = dVar7 * local_48;
    goto LAB_00118a19;
  case 0x15:
    a_01 = sexp_bignum_mul(ctx,(sexp)0x0,a_00,a);
LAB_001189ec:
    psStack_50 = sexp_bignum_normalize(a_01);
  }
switchD_001188c0_caseD_5:
  (ctx->value).context.saves = local_38.next;
  return psStack_50;
}

Assistant:

sexp sexp_mul (sexp ctx, sexp a, sexp b) {
  sexp_lsint_t prod;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    prod = lsint_mul_sint(lsint_from_sint(sexp_unbox_fixnum(a)), sexp_unbox_fixnum(b));
    if (!lsint_is_fixnum(prod))
      r = sexp_mul(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(lsint_to_sint(prod));
    break;
  case SEXP_NUM_FIX_FLO:
    r = (a==SEXP_ZERO ? a : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)*sexp_flonum_value(b)));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_fxmul(ctx, NULL, b, sexp_unbox_fx_abs(a), 0);
    sexp_bignum_sign(r) = sexp_fx_sign(a) * sexp_bignum_sign(b);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_mul(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_mul(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_mul(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_mul(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}